

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<long,long,long,duckdb::BinaryStandardOperatorWrapper,duckdb::DecimalMultiplyOverflowCheck,bool,true,false>
               (long *ldata,long *rdata,long *result_data,idx_t count,ValidityMask *mask,bool fun)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  OutOfRangeException *pOVar6;
  ulong uVar7;
  idx_t iVar8;
  ulong uVar9;
  ulong uVar10;
  string local_58;
  unsigned_long *local_38;
  
  local_38 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (local_38 == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar2 = *ldata;
      iVar8 = 0;
      do {
        lVar3 = rdata[iVar8];
        lVar4 = lVar2 * lVar3;
        if ((SEXT816(lVar4) != SEXT816(lVar2) * SEXT816(lVar3)) ||
           (lVar4 + 0xf21f494c589c0000U < 0xe43e9298b1380001)) {
          pOVar6 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,
                     "Overflow in multiplication of DECIMAL(18) (%d * %d). You might want to add an explicit cast to a bigger decimal."
                     ,"");
          OutOfRangeException::OutOfRangeException<long,long>(pOVar6,&local_58,lVar2,lVar3);
          __cxa_throw(pOVar6,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
        result_data[iVar8] = lVar4;
        iVar8 = iVar8 + 1;
      } while (count != iVar8);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar7 = 0;
    uVar9 = 0;
    do {
      uVar1 = local_38[uVar7];
      uVar10 = uVar9 + 0x40;
      if (count <= uVar9 + 0x40) {
        uVar10 = count;
      }
      uVar5 = uVar10;
      if (uVar1 != 0) {
        uVar5 = uVar9;
        if (uVar1 == 0xffffffffffffffff) {
          if (uVar9 < uVar10) {
            lVar2 = *ldata;
            do {
              lVar3 = rdata[uVar9];
              lVar4 = lVar2 * lVar3;
              if ((SEXT816(lVar4) != SEXT816(lVar2) * SEXT816(lVar3)) ||
                 (lVar4 + 0xf21f494c589c0000U < 0xe43e9298b1380001)) {
                pOVar6 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
                local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_58,
                           "Overflow in multiplication of DECIMAL(18) (%d * %d). You might want to add an explicit cast to a bigger decimal."
                           ,"");
                OutOfRangeException::OutOfRangeException<long,long>(pOVar6,&local_58,lVar2,lVar3);
                __cxa_throw(pOVar6,&OutOfRangeException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              result_data[uVar9] = lVar4;
              uVar9 = uVar9 + 1;
              uVar5 = uVar9;
            } while (uVar10 != uVar9);
          }
        }
        else if (uVar9 < uVar10) {
          uVar5 = 0;
          do {
            if ((uVar1 >> (uVar5 & 0x3f) & 1) != 0) {
              lVar2 = *ldata;
              lVar3 = rdata[uVar9 + uVar5];
              lVar4 = lVar2 * lVar3;
              if ((SEXT816(lVar4) != SEXT816(lVar2) * SEXT816(lVar3)) ||
                 (lVar4 + 0xf21f494c589c0000U < 0xe43e9298b1380001)) {
                pOVar6 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
                local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_58,
                           "Overflow in multiplication of DECIMAL(18) (%d * %d). You might want to add an explicit cast to a bigger decimal."
                           ,"");
                OutOfRangeException::OutOfRangeException<long,long>(pOVar6,&local_58,lVar2,lVar3);
                __cxa_throw(pOVar6,&OutOfRangeException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              result_data[uVar9 + uVar5] = lVar4;
            }
            uVar5 = uVar5 + 1;
          } while ((uVar9 - uVar10) + uVar5 != 0);
          uVar5 = uVar9 + uVar5;
        }
      }
      uVar7 = uVar7 + 1;
      uVar9 = uVar5;
    } while (uVar7 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}